

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

optional<pbrt::CameraRay> * __thiscall
pstd::optional<pbrt::CameraRay>::operator=
          (optional<pbrt::CameraRay> *this,optional<pbrt::CameraRay> *v)

{
  bool bVar1;
  optional<pbrt::CameraRay> *this_00;
  optional<pbrt::CameraRay> *in_RSI;
  optional<pbrt::CameraRay> *in_RDI;
  CameraRay *in_stack_ffffffffffffffd8;
  optional<pbrt::CameraRay> *in_stack_ffffffffffffffe0;
  
  reset(in_stack_ffffffffffffffe0);
  bVar1 = has_value(in_RSI);
  if (bVar1) {
    this_00 = (optional<pbrt::CameraRay> *)ptr((optional<pbrt::CameraRay> *)0x8af9d7);
    value(this_00);
    pbrt::CameraRay::CameraRay((CameraRay *)this_00,in_stack_ffffffffffffffd8);
    in_RDI->set = true;
    reset(this_00);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(optional &&v) {
        reset();
        if (v.has_value()) {
            new (ptr()) T(std::move(v.value()));
            set = true;
            v.reset();
        }
        return *this;
    }